

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall kj::Maybe<kj::OwnFd>::Maybe(Maybe<kj::OwnFd> *this,Maybe<kj::OwnFd> *other)

{
  bool bVar1;
  
  bVar1 = (other->ptr).isSet;
  (this->ptr).isSet = bVar1;
  if (bVar1 == true) {
    (this->ptr).field_1 = (other->ptr).field_1;
    (other->ptr).field_1 = (anon_union_4_1_a8c68091_for_NullableValue<kj::OwnFd>_2)0xffffffff;
  }
  if ((other->ptr).isSet == true) {
    (other->ptr).isSet = false;
    OwnFd::~OwnFd(&(other->ptr).field_1.value);
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }